

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beatnik.hpp
# Opt level: O1

float_t __thiscall
re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::estimate_tempo
          (beatnik<float,_1024L,_128L,_2048L,_128L> *this)

{
  float fVar1;
  
  fVar1 = tracker<float,_256L,_4L>::estimate_period(&this->tracker_);
  for (fVar1 = this->frames_per_minute / fVar1; 180.0 < fVar1; fVar1 = fVar1 * 0.5) {
  }
  for (; fVar1 < 90.0; fVar1 = fVar1 + fVar1) {
  }
  return fVar1;
}

Assistant:

float_t
    estimate_tempo() noexcept
    {
        float_t period = tracker_.estimate_period();

        auto bpm = frames_per_minute / period;
        while (bpm > max_tempo) {
            bpm /= 2;
        }
        while (bpm < min_tempo) {
            bpm *= 2;
        }

        return bpm;
    }